

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::InstanceBodySymbol::InstanceBodySymbol
          (InstanceBodySymbol *this,Compilation *compilation,DefinitionSymbol *definition,
          HierarchyOverrideNode *hierarchyOverrideNode,bitmask<slang::ast::InstanceFlags> flags)

{
  Scope *scope;
  undefined8 in_RCX;
  Symbol *in_RDX;
  Symbol *in_RDI;
  undefined1 in_R8B;
  SymbolIndex index;
  Compilation *in_stack_ffffffffffffffb8;
  SourceLocation location;
  
  location = in_RDX->location;
  Symbol::Symbol(in_RDI,InstanceBody,in_RDX->name,location);
  Scope::Scope((Scope *)location,in_stack_ffffffffffffffb8,in_RDI);
  in_RDI[1].originatingSyntax = (SyntaxNode *)0x0;
  *(undefined8 *)(in_RDI + 2) = in_RCX;
  *(undefined1 *)&in_RDI[2].name._M_len = in_R8B;
  in_RDI[2].name._M_str = (char *)in_RDX;
  std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::span
            ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)0xfc4db8);
  index = (SymbolIndex)((ulong)in_RDI >> 0x20);
  std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>::span
            ((span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL> *)0xfc4dc9)
  ;
  scope = Symbol::getParentScope(in_RDX);
  Symbol::getIndex(in_RDX);
  Symbol::setParent((Symbol *)location,scope,index);
  return;
}

Assistant:

InstanceBodySymbol::InstanceBodySymbol(Compilation& compilation, const DefinitionSymbol& definition,
                                       const HierarchyOverrideNode* hierarchyOverrideNode,
                                       bitmask<InstanceFlags> flags) :
    Symbol(SymbolKind::InstanceBody, definition.name, definition.location),
    Scope(compilation, this), hierarchyOverrideNode(hierarchyOverrideNode), flags(flags),
    definition(definition) {

    setParent(*definition.getParentScope(), definition.getIndex());
}